

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding_test.cc
# Opt level: O2

void __thiscall leveldb::_Test_Varint64::_Run(_Test_Varint64 *this)

{
  char *pcVar1;
  uint32_t k;
  long lVar2;
  char *limit_00;
  _Alloc_hider p_00;
  size_t i;
  ulong uVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  int local_214;
  uint64_t actual;
  char *p;
  string s;
  long local_1e0;
  char *limit;
  uint64_t power;
  
  values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  power = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&values,&power);
  power = 100;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&values,&power);
  power = 0xffffffffffffffff;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&values,&power);
  power = 0xfffffffffffffffe;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&values,&power);
  for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 1) {
    power = 1L << ((byte)lVar2 & 0x3f);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&values,&power);
    s._M_dataplus._M_p = (pointer)(power - 1);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (&values,(unsigned_long *)&s);
    s._M_dataplus._M_p = (pointer)(power + 1);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (&values,(unsigned_long *)&s);
  }
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  uVar3 = 0;
  while( true ) {
    if ((ulong)((long)values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) <= uVar3) break;
    PutVarint64(&s,values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar3]);
    uVar3 = uVar3 + 1;
  }
  p = s._M_dataplus._M_p;
  limit_00 = s._M_dataplus._M_p + s._M_string_length;
  lVar2 = 0;
  p_00._M_p = s._M_dataplus._M_p;
  limit = limit_00;
  for (uVar3 = 0;
      uVar3 < (ulong)((long)values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar3 = uVar3 + 1) {
    test::Tester::Tester
              ((Tester *)&power,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
               ,0x7b);
    test::Tester::Is((Tester *)&power,p_00._M_p < limit_00,"p < limit");
    test::Tester::~Tester((Tester *)&power);
    pcVar1 = GetVarint64Ptr(p_00._M_p,limit_00,&actual);
    p = pcVar1;
    test::Tester::Tester
              ((Tester *)&power,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
               ,0x7f);
    test::Tester::Is((Tester *)&power,pcVar1 != (char *)0x0,"p != nullptr");
    test::Tester::~Tester((Tester *)&power);
    test::Tester::Tester
              ((Tester *)&power,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
               ,0x80);
    test::Tester::IsEq<unsigned_long,unsigned_long>
              ((Tester *)&power,
               (unsigned_long *)
               ((long)values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar2),&actual);
    test::Tester::~Tester((Tester *)&power);
    test::Tester::Tester
              ((Tester *)&power,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
               ,0x81);
    local_214 = VarintLength(actual);
    local_1e0 = (long)pcVar1 - (long)p_00._M_p;
    test::Tester::IsEq<int,long>((Tester *)&power,&local_214,&local_1e0);
    test::Tester::~Tester((Tester *)&power);
    lVar2 = lVar2 + 8;
    p_00._M_p = pcVar1;
  }
  test::Tester::Tester
            ((Tester *)&power,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
             ,0x83);
  test::Tester::IsEq<char_const*,char_const*>((Tester *)&power,&p,&limit);
  test::Tester::~Tester((Tester *)&power);
  std::__cxx11::string::~string((string *)&s);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

TEST(Coding, Varint64) {
  // Construct the list of values to check
  std::vector<uint64_t> values;
  // Some special values
  values.push_back(0);
  values.push_back(100);
  values.push_back(~static_cast<uint64_t>(0));
  values.push_back(~static_cast<uint64_t>(0) - 1);
  for (uint32_t k = 0; k < 64; k++) {
    // Test values near powers of two
    const uint64_t power = 1ull << k;
    values.push_back(power);
    values.push_back(power - 1);
    values.push_back(power + 1);
  }

  std::string s;
  for (size_t i = 0; i < values.size(); i++) {
    PutVarint64(&s, values[i]);
  }

  const char* p = s.data();
  const char* limit = p + s.size();
  for (size_t i = 0; i < values.size(); i++) {
    ASSERT_TRUE(p < limit);
    uint64_t actual;
    const char* start = p;
    p = GetVarint64Ptr(p, limit, &actual);
    ASSERT_TRUE(p != nullptr);
    ASSERT_EQ(values[i], actual);
    ASSERT_EQ(VarintLength(actual), p - start);
  }
  ASSERT_EQ(p, limit);
}